

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O2

void mdef_sseq2sen_active(mdef_t *mdef,uint8 *sseq,uint8 *sen)

{
  s3senid_t *psVar1;
  int32 ss;
  long lVar2;
  long lVar3;
  
  for (lVar2 = 0; lVar2 < mdef->n_sseq; lVar2 = lVar2 + 1) {
    if (sseq[lVar2] != '\0') {
      psVar1 = mdef->sseq[lVar2];
      for (lVar3 = 0; lVar3 < mdef->n_emit_state; lVar3 = lVar3 + 1) {
        sen[psVar1[lVar3]] = '\x01';
      }
    }
  }
  return;
}

Assistant:

void
mdef_sseq2sen_active(mdef_t * mdef, uint8 * sseq, uint8 * sen)
{
    int32 ss, i;
    s3senid_t *sp;

    for (ss = 0; ss < mdef_n_sseq(mdef); ss++) {
        if (sseq[ss]) {
            sp = mdef->sseq[ss];
            for (i = 0; i < mdef_n_emit_state(mdef); i++)
                sen[sp[i]] = 1;
        }
    }
}